

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerConsole.cxx
# Opt level: O2

void __thiscall
cmDebugServerConsole::OnWatchpoint
          (cmDebugServerConsole *this,string *variable,int access,string *newValue)

{
  ostream *poVar1;
  char *pcVar2;
  stringstream ss;
  string sStack_1c8;
  stringstream local_1a8 [16];
  ostream local_198;
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(&local_198,"Watchpoint \'");
  poVar1 = std::operator<<(poVar1,(string *)variable);
  poVar1 = std::operator<<(poVar1,"\' hit -- \'");
  poVar1 = std::operator<<(poVar1,(string *)newValue);
  poVar1 = std::operator<<(poVar1,"\' (");
  pcVar2 = cmVariableWatch::GetAccessAsString(access);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,")");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(poVar1,(string *)&PROMPT_abi_cxx11_);
  std::__cxx11::stringbuf::str();
  cmDebugServer::AsyncBroadcast(&this->super_cmDebugServer,&sStack_1c8);
  std::__cxx11::string::~string((string *)&sStack_1c8);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return;
}

Assistant:

void cmDebugServerConsole::OnWatchpoint(const std::string& variable,
                                        int access,
                                        const std::string& newValue)
{
  std::stringstream ss;
  ss << "Watchpoint '" << variable << "' hit -- '" << newValue << "' ("
     << cmVariableWatch::GetAccessAsString(access) << ")" << std::endl
     << PROMPT;

  AsyncBroadcast(ss.str());
}